

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompStep(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  int ch1;
  xmlXPathContextPtr ctxt_00;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pbVar5 = ctxt->cur;
  while( true ) {
    pbVar4 = pbVar5 + 1;
    bVar1 = *pbVar5;
    uVar10 = (ulong)bVar1;
    if (0x2e < uVar10) break;
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
      if (uVar10 == 0x2a) goto LAB_001c6a89;
      if (uVar10 == 0x2e) {
        if (*pbVar4 == 0x2e) goto LAB_001c696e;
        if (bVar1 == 0x2a) goto LAB_001c6a89;
        if (bVar1 == 0x2e) {
          while( true ) {
            ctxt->cur = pbVar4;
            if (0x20 < (ulong)*pbVar4) {
              return;
            }
            if ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0) break;
            pbVar4 = pbVar4 + 1;
          }
          return;
        }
      }
      break;
    }
    ctxt->cur = pbVar4;
    pbVar5 = pbVar4;
  }
  pbVar5 = xmlXPathParseNCName(ctxt);
  if (pbVar5 == (byte *)0x0) {
    if (*ctxt->cur == '@') {
      ctxt->cur = ctxt->cur + 1;
      uVar12 = 3;
    }
    else {
LAB_001c6a89:
      uVar12 = 4;
    }
    pbVar5 = (byte *)0x0;
    goto LAB_001c6a92;
  }
  bVar1 = *pbVar5;
  uVar13 = 0;
  if (0x6d < bVar1) {
    if (bVar1 == 0x6e) {
      iVar3 = xmlStrEqual(pbVar5,"namespace");
      uVar13 = (uint)(iVar3 != 0) * 9;
    }
    else {
      if (bVar1 == 0x70) {
        iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"parent");
        uVar12 = 10;
        if (iVar3 == 0) {
          uVar12 = 0;
        }
        iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"preceding");
        uVar11 = 0xb;
        if (iVar3 == 0) {
          uVar11 = uVar12;
        }
        iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"preceding-sibling");
        bVar9 = iVar3 == 0;
        uVar13 = 0xc;
        goto LAB_001c6dc0;
      }
      if (bVar1 == 0x73) {
        iVar3 = xmlStrEqual(pbVar5,"self");
        uVar13 = 0xd;
        if (iVar3 == 0) {
          uVar13 = 0;
        }
      }
    }
    goto switchD_001c6a22_caseD_62;
  }
  switch(bVar1) {
  case 0x61:
    iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"ancestor");
    iVar2 = xmlStrEqual(pbVar5,(xmlChar *)"ancestor-or-self");
    uVar11 = 2;
    if (iVar2 == 0) {
      uVar11 = (uint)(iVar3 != 0);
    }
    iVar3 = xmlStrEqual(pbVar5,"attribute");
    bVar9 = iVar3 == 0;
    uVar13 = 3;
    break;
  default:
    goto switchD_001c6a22_caseD_62;
  case 99:
    iVar3 = xmlStrEqual(pbVar5,"child");
    uVar13 = (uint)(iVar3 != 0) << 2;
    goto switchD_001c6a22_caseD_62;
  case 100:
    iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"descendant");
    uVar11 = (uint)(iVar3 != 0) * 5;
    iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"descendant-or-self");
    bVar9 = iVar3 == 0;
    uVar13 = 6;
    break;
  case 0x66:
    iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"following");
    uVar11 = 7;
    if (iVar3 == 0) {
      uVar11 = 0;
    }
    iVar3 = xmlStrEqual(pbVar5,(xmlChar *)"following-sibling");
    bVar9 = iVar3 == 0;
    uVar13 = 8;
  }
LAB_001c6dc0:
  if (bVar9) {
    uVar13 = uVar11;
  }
switchD_001c6a22_caseD_62:
  uVar12 = 4;
  if (uVar13 != 0) {
    pbVar4 = ctxt->cur;
    while( true ) {
      pbVar8 = pbVar4 + 1;
      uVar10 = (ulong)*pbVar4;
      if (0x3a < uVar10) break;
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
        if ((uVar10 == 0x3a) && (*pbVar8 == 0x3a)) {
          ctxt->cur = pbVar4 + 2;
          (*xmlFree)(pbVar5);
          pbVar5 = (byte *)0x0;
          uVar12 = uVar13;
        }
        break;
      }
      ctxt->cur = pbVar8;
      pbVar4 = pbVar8;
    }
  }
LAB_001c6a92:
  if (ctxt->error != 0) goto LAB_001c6aa2;
  pbVar4 = ctxt->cur;
  while( true ) {
    pbVar8 = pbVar4 + 1;
    bVar1 = *pbVar4;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar8;
    pbVar4 = pbVar8;
  }
  if ((pbVar5 == (byte *)0x0) && (bVar1 == 0x2a)) {
    ctxt->cur = pbVar8;
    iVar3 = 3;
LAB_001c6b5b:
    pbVar4 = (byte *)0x0;
LAB_001c6b5e:
    iVar2 = 0;
    pbVar5 = (byte *)0x0;
  }
  else {
    pbVar4 = pbVar5;
    if (pbVar5 == (byte *)0x0) {
      pbVar4 = xmlXPathParseNCName(ctxt);
    }
    if (pbVar4 == (byte *)0x0) {
      xmlXPathErr(ctxt,7);
      iVar3 = 0;
      goto LAB_001c6b5b;
    }
    pbVar8 = ctxt->cur;
    bVar1 = *pbVar8;
    if (bVar1 == 0x20) {
      bVar9 = false;
    }
    else {
      bVar9 = bVar1 != 0xd && (byte)(bVar1 - 0xb) < 0xfe;
    }
LAB_001c6c50:
    pbVar7 = pbVar8 + 1;
    uVar10 = (ulong)*pbVar8;
    if (uVar10 < 0x29) {
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001c6c4d;
      if (uVar10 == 0x28) {
        ctxt->cur = pbVar7;
        iVar3 = xmlStrEqual(pbVar4,"comment");
        iVar2 = 0;
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(pbVar4,"node");
          if (iVar3 != 0) goto LAB_001c6e39;
          iVar3 = xmlStrEqual(pbVar4,(xmlChar *)"processing-instruction");
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(pbVar4,"text");
            if (iVar3 != 0) {
              iVar2 = 3;
              goto LAB_001c6e39;
            }
            (*xmlFree)(pbVar4);
            xmlXPathErr(ctxt,7);
            iVar3 = 0;
            goto LAB_001c6b5b;
          }
          iVar2 = 7;
          bVar9 = true;
        }
        else {
          iVar2 = 8;
LAB_001c6e39:
          bVar9 = false;
        }
        pbVar5 = ctxt->cur;
        while( true ) {
          if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
          break;
          ctxt->cur = pbVar5 + 1;
          pbVar5 = pbVar5 + 1;
        }
        iVar3 = 1;
        if (bVar9) {
          (*xmlFree)(pbVar4);
          if (*ctxt->cur == ')') {
            pbVar4 = (byte *)0x0;
            iVar3 = 1;
          }
          else {
            pbVar4 = xmlXPathParseLiteral(ctxt);
            pbVar5 = ctxt->cur;
            while( true ) {
              if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
              break;
              ctxt->cur = pbVar5 + 1;
              pbVar5 = pbVar5 + 1;
            }
            iVar3 = 2;
          }
        }
        if (*ctxt->cur == ')') {
          ctxt->cur = ctxt->cur + 1;
          pbVar5 = pbVar4;
          goto LAB_001c6ed2;
        }
        if (pbVar4 != (byte *)0x0) {
          (*xmlFree)(pbVar4);
        }
        xmlXPathErr(ctxt,8);
        pbVar4 = (byte *)0x0;
        pbVar5 = (byte *)0x0;
        goto LAB_001c6b61;
      }
    }
    iVar2 = 0;
    iVar3 = 5;
    pbVar5 = pbVar4;
    if (bVar9 && *pbVar8 == 0x3a) {
      ctxt->cur = pbVar7;
      if (*pbVar7 != 0x2a) {
        pbVar5 = xmlXPathParseNCName(ctxt);
        if (pbVar5 == (byte *)0x0) {
          xmlXPathErr(ctxt,7);
          pbVar5 = (byte *)0x0;
        }
        iVar2 = 0;
        iVar3 = 5;
        goto LAB_001c6b61;
      }
      ctxt->cur = pbVar8 + 2;
      iVar3 = 3;
      goto LAB_001c6b5e;
    }
LAB_001c6ed2:
    pbVar4 = (byte *)0x0;
  }
LAB_001c6b61:
  if (iVar3 != 0) {
    if ((((pbVar4 != (byte *)0x0) && (ctxt_00 = ctxt->context, ctxt_00 != (xmlXPathContextPtr)0x0))
        && ((ctxt_00->flags & 1) != 0)) &&
       (pxVar6 = xmlXPathNsLookup(ctxt_00,pbVar4), pxVar6 == (xmlChar *)0x0)) {
      xmlXPathErr(ctxt,0x13);
    }
    ch1 = ctxt->comp->last;
    ctxt->comp->last = -1;
    pbVar8 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar8 + 1;
      pbVar8 = pbVar8 + 1;
    }
    while (*ctxt->cur == '[') {
      xmlXPathCompPredicate(ctxt,0);
    }
    iVar3 = xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_COLLECT,uVar12,iVar3,iVar2,pbVar4
                                ,pbVar5);
    if (iVar3 == -1) {
      (*xmlFree)(pbVar4);
LAB_001c6aa2:
      (*xmlFree)(pbVar5);
      return;
    }
  }
  return;
LAB_001c6c4d:
  ctxt->cur = pbVar7;
  pbVar8 = pbVar7;
  goto LAB_001c6c50;
  while ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0) {
LAB_001c696e:
    pbVar4 = pbVar4 + 1;
    ctxt->cur = pbVar4;
    if (0x20 < (ulong)*pbVar4) break;
  }
  xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,10,1,0,(void *)0x0,(void *)0x0);
  return;
}

Assistant:

static void
xmlXPathCompStep(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if ((CUR == '.') && (NXT(1) == '.')) {
	SKIP(2);
	SKIP_BLANKS;
	PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_PARENT,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
    } else if (CUR == '.') {
	NEXT;
	SKIP_BLANKS;
    } else {
	xmlChar *name = NULL;
	xmlChar *prefix = NULL;
	xmlXPathTestVal test = (xmlXPathTestVal) 0;
	xmlXPathAxisVal axis = (xmlXPathAxisVal) 0;
	xmlXPathTypeVal type = (xmlXPathTypeVal) 0;
	int op1;

	if (CUR == '*') {
	    axis = AXIS_CHILD;
	} else {
	    if (name == NULL)
		name = xmlXPathParseNCName(ctxt);
	    if (name != NULL) {
		axis = xmlXPathIsAxisName(name);
		if (axis != 0) {
		    SKIP_BLANKS;
		    if ((CUR == ':') && (NXT(1) == ':')) {
			SKIP(2);
			xmlFree(name);
			name = NULL;
		    } else {
			/* an element name can conflict with an axis one :-\ */
			axis = AXIS_CHILD;
		    }
		} else {
		    axis = AXIS_CHILD;
		}
	    } else if (CUR == '@') {
		NEXT;
		axis = AXIS_ATTRIBUTE;
	    } else {
		axis = AXIS_CHILD;
	    }
	}

        if (ctxt->error != XPATH_EXPRESSION_OK) {
            xmlFree(name);
            return;
        }

	name = xmlXPathCompNodeTest(ctxt, &test, &type, &prefix, name);
	if (test == 0)
	    return;

        if ((prefix != NULL) && (ctxt->context != NULL) &&
	    (ctxt->context->flags & XML_XPATH_CHECKNS)) {
	    if (xmlXPathNsLookup(ctxt->context, prefix) == NULL) {
		xmlXPathErr(ctxt, XPATH_UNDEF_PREFIX_ERROR);
	    }
	}

	op1 = ctxt->comp->last;
	ctxt->comp->last = -1;

	SKIP_BLANKS;
	while (CUR == '[') {
	    xmlXPathCompPredicate(ctxt, 0);
	}

        if (PUSH_FULL_EXPR(XPATH_OP_COLLECT, op1, ctxt->comp->last, axis,
                           test, type, (void *)prefix, (void *)name) == -1) {
            xmlFree(prefix);
            xmlFree(name);
        }
    }
}